

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# client.cpp
# Opt level: O0

void __thiscall CGraph::Scale(CGraph *this)

{
  int i;
  CGraph *this_local;
  
  this->m_Min = this->m_MinRange;
  this->m_Max = this->m_MaxRange;
  for (i = 0; i < 0x80; i = i + 1) {
    if (this->m_aValues[i] < this->m_Max || this->m_aValues[i] == this->m_Max) {
      if (this->m_aValues[i] < this->m_Min) {
        this->m_Min = this->m_aValues[i];
      }
    }
    else {
      this->m_Max = this->m_aValues[i];
    }
  }
  return;
}

Assistant:

void CGraph::Scale()
{
	m_Min = m_MinRange;
	m_Max = m_MaxRange;
	for(int i = 0; i < MAX_VALUES; i++)
	{
		if(m_aValues[i] > m_Max)
			m_Max = m_aValues[i];
		else if(m_aValues[i] < m_Min)
			m_Min = m_aValues[i];
	}
}